

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QDir *dir)

{
  uint uVar1;
  long lVar2;
  QDirPrivate *pQVar3;
  QDebug *pQVar4;
  QDir *in_RDX;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QArrayDataPointer<QString> local_100;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QDebugStateSaver save;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  QDebugStateSaver save_1;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  save.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&save,(QDebug *)dir);
  QDebug::resetFormat((QDebug *)dir);
  pQVar4 = QDebug::operator<<((QDebug *)dir,"QDir(");
  QDir::path((QString *)&local_d0,in_RDX);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_d0);
  pQVar4 = QDebug::operator<<(pQVar4,", nameFilters = {");
  QDir::nameFilters((QStringList *)&local_100,in_RDX);
  QListSpecialMethods<QString>::join
            ((QString *)&local_e8,(QListSpecialMethods<QString> *)&local_100,(QChar)0x2c);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_e8);
  pQVar4 = QDebug::operator<<(pQVar4,"}, ");
  local_b8.stream = pQVar4->stream;
  (local_b8.stream)->ref = (local_b8.stream)->ref + 1;
  uVar1 = (((in_RDX->d_ptr).d.ptr)->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
          super_QFlagsStorage<QDir::SortFlag>.i;
  save_1.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&save_1,&local_b8);
  QDebug::resetFormat(&local_b8);
  if (uVar1 == 0xffffffff) {
    QDebug::operator<<(&local_b8,"QDir::SortFlags(NoSort)");
  }
  else {
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    other.m_data = &DAT_00465568 + *(int *)(&DAT_00465568 + (ulong)(uVar1 & 3) * 4);
    other.m_size = *(qsizetype *)(&DAT_00465548 + (ulong)(uVar1 & 3) * 8);
    QString::operator=((QString *)&local_58,other);
    local_78.d = (Data *)0x0;
    local_78.ptr = (QString *)0x0;
    local_78.size = 0;
    if ((uVar1 & 4) != 0) {
      latin1.m_data = "DirsFirst";
      latin1.m_size = 9;
      QString::QString((QString *)&local_90,latin1);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if ((uVar1 & 0x20) != 0) {
      latin1_00.m_data = "DirsLast";
      latin1_00.m_size = 8;
      QString::QString((QString *)&local_90,latin1_00);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if ((uVar1 & 0x10) != 0) {
      latin1_01.m_data = "IgnoreCase";
      latin1_01.m_size = 10;
      QString::QString((QString *)&local_90,latin1_01);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if ((uVar1 & 0x40) != 0) {
      latin1_02.m_data = "LocaleAware";
      latin1_02.m_size = 0xb;
      QString::QString((QString *)&local_90,latin1_02);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if ((char)uVar1 < '\0') {
      latin1_03.m_data = "Type";
      latin1_03.m_size = 4;
      QString::QString((QString *)&local_90,latin1_03);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    (local_b8.stream)->noQuotes = true;
    pQVar4 = QDebug::operator<<(&local_b8,"QDir::SortFlags(");
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_58);
    pQVar4 = QDebug::operator<<(pQVar4,'|');
    QListSpecialMethods<QString>::join
              ((QString *)&local_90,(QListSpecialMethods<QString> *)&local_78,(QChar)0x7c);
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_90);
    QDebug::operator<<(pQVar4,')');
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  local_b0.stream = local_b8.stream;
  local_b8.stream = (Stream *)0x0;
  QDebugStateSaver::~QDebugStateSaver(&save_1);
  pQVar4 = QDebug::operator<<(&local_b0,',');
  local_a8.stream = pQVar4->stream;
  (local_a8.stream)->ref = (local_a8.stream)->ref + 1;
  operator<<((Stream *)&local_a0,(QFlagsStorageHelper<QDir::Filter,_4>)SUB84(&local_a8,0));
  QDebug::operator<<(&local_a0,')');
  QDebug::~QDebug(&local_a0);
  QDebug::~QDebug(&local_a8);
  QDebug::~QDebug(&local_b0);
  QDebug::~QDebug(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_100);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar3 = (dir->d_ptr).d.ptr;
  (dir->d_ptr).d.ptr = (QDirPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar3;
  QDebugStateSaver::~QDebugStateSaver(&save);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDir &dir)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    debug << "QDir(" << dir.path() << ", nameFilters = {"
          << dir.nameFilters().join(u',')
          << "}, "
          << dir.sorting()
          << ','
          << dir.filter()
          << ')';
    return debug;
}